

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Parse3CachedRE2(int iters,char *regexp,StringPiece *text)

{
  bool bVar1;
  string *__lhs;
  ostream *poVar2;
  LogMessage local_460;
  StringPiece *local_2e0;
  StringPiece *local_2d8;
  StringPiece *local_2d0;
  int local_2c4;
  undefined1 local_2c0 [4];
  int i;
  StringPiece sp3;
  StringPiece sp2;
  StringPiece sp1;
  undefined1 local_100 [8];
  RE2 re;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  re._216_8_ = text;
  RE2::RE2((RE2 *)local_100,regexp);
  __lhs = RE2::error_abi_cxx11_((RE2 *)local_100);
  bVar1 = std::operator==(__lhs,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&sp1.length_,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x49d);
    poVar2 = LogMessage::stream((LogMessage *)&sp1.length_);
    std::operator<<(poVar2,"Check failed: (re.error()) == (\"\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&sp1.length_);
  }
  StringPiece::StringPiece((StringPiece *)&sp2.length_);
  StringPiece::StringPiece((StringPiece *)&sp3.length_);
  StringPiece::StringPiece((StringPiece *)local_2c0);
  for (local_2c4 = 0; local_2c4 < iters; local_2c4 = local_2c4 + 1) {
    local_2d0 = (StringPiece *)&sp2.length_;
    local_2d8 = (StringPiece *)&sp3.length_;
    local_2e0 = (StringPiece *)local_2c0;
    bVar1 = RE2::FullMatch<re2::StringPiece*,re2::StringPiece*,re2::StringPiece*>
                      ((StringPiece *)re._216_8_,(RE2 *)local_100,&local_2d0,&local_2d8,&local_2e0);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_460,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x4a0);
      poVar2 = LogMessage::stream(&local_460);
      std::operator<<(poVar2,"Check failed: RE2::FullMatch(text, re, &sp1, &sp2, &sp3)");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_460);
    }
  }
  RE2::~RE2((RE2 *)local_100);
  return;
}

Assistant:

void Parse3CachedRE2(int iters, const char* regexp, const StringPiece& text) {
  RE2 re(regexp);
  CHECK_EQ(re.error(), "");
  StringPiece sp1, sp2, sp3;
  for (int i = 0; i < iters; i++) {
    CHECK(RE2::FullMatch(text, re, &sp1, &sp2, &sp3));
  }
}